

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::GenericSwap(MessageLite *m1,MessageLite *m2)

{
  MessageLite *this;
  
  this = MessageLite::New(m1,(Arena *)0x0);
  MessageLite::CheckTypeAndMergeFrom(this,m1);
  (*m1->_vptr_MessageLite[2])(m1);
  MessageLite::CheckTypeAndMergeFrom(m1,m2);
  (*m2->_vptr_MessageLite[2])(m2);
  MessageLite::CheckTypeAndMergeFrom(m2,this);
  (*this->_vptr_MessageLite[1])(this);
  return;
}

Assistant:

void GenericSwap(MessageLite* m1, MessageLite* m2) {
  std::unique_ptr<MessageLite> tmp(m1->New());
  tmp->CheckTypeAndMergeFrom(*m1);
  m1->Clear();
  m1->CheckTypeAndMergeFrom(*m2);
  m2->Clear();
  m2->CheckTypeAndMergeFrom(*tmp);
}